

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QMainWindowLayoutState::item(QMainWindowLayoutState *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  QToolBarAreaLayoutItem *pQVar3;
  QDockAreaLayoutItem *pQVar4;
  QList<int> *in_RSI;
  QToolBarAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem *tbItem;
  int i;
  QList<int> *in_stack_ffffffffffffff80;
  QDockAreaLayout *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  QToolBarAreaLayout *this_00;
  QLayoutItem *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  piVar2 = QList<int>::first(in_stack_ffffffffffffff80);
  if (*piVar2 == 0) {
    QList<int>::mid(in_RSI,(ulong)in_stack_ffffffffffffffa8,(qsizetype)in_stack_ffffffffffffffa0);
    pQVar3 = QToolBarAreaLayout::item(this_00,in_RSI);
    QList<int>::~QList((QList<int> *)0x5f447e);
    local_40 = pQVar3->widgetItem;
  }
  else if (*piVar2 == 1) {
    QList<int>::mid(in_RSI,CONCAT44(1,in_stack_ffffffffffffffa8),
                    (qsizetype)in_stack_ffffffffffffffa0);
    pQVar4 = QDockAreaLayout::item(in_stack_ffffffffffffffa0,(QList<int> *)in_RDI);
    local_40 = pQVar4->widgetItem;
    QList<int>::~QList((QList<int> *)0x5f44ea);
  }
  else {
    local_40 = (QLayoutItem *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayoutState::item(const QList<int> &path)
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0) {
        const QToolBarAreaLayoutItem *tbItem = toolBarAreaLayout.item(path.mid(1));
        Q_ASSERT(tbItem);
        return tbItem->widgetItem;
    }
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.item(path.mid(1)).widgetItem;
#endif // QT_CONFIG(dockwidget)

    return nullptr;
}